

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::handleProtectEncoding
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  PragmaExpressionSyntax *pPVar1;
  _Alloc_hider __s1;
  size_type sVar2;
  int iVar3;
  ParenPragmaExpressionSyntax *pPVar4;
  ulong uVar5;
  SyntaxNode *pSVar6;
  NameValuePragmaExpressionSyntax *pNVar7;
  size_t sVar8;
  Diagnostic *pDVar9;
  optional<unsigned_int> oVar10;
  char *__s1_00;
  size_type __rlen;
  size_type __rlen_3;
  size_t index;
  string_view sVar11;
  SourceRange SVar12;
  string_view arg;
  string valueText;
  Token value;
  Token local_70;
  string local_60;
  Token local_40;
  
  local_70.info = keyword.info;
  local_70._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar12 = Token::range(&local_70);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pPVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                           (&args->super_SyntaxNode), (pPVar4->values).elements.size_ != 0)) {
      this->protectLineLength = 0;
      this->protectBytes = 0;
      pPVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      uVar5 = (pPVar4->values).elements.size_ + 1;
      if (uVar5 < 2) {
        return;
      }
      index = 0;
      do {
        pSVar6 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  operator[](&pPVar4->values,index)->super_SyntaxNode;
        if (pSVar6->kind == NameValuePragmaExpression) {
          pNVar7 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                             (pSVar6);
          sVar11 = Token::valueText(&pNVar7->name);
          __s1_00 = sVar11._M_str;
          sVar8 = sVar11._M_len;
          if ((long)sVar8 < 7) {
LAB_0019d39c:
            if (sVar8 != 0) {
              if ((sVar8 != 5) || (iVar3 = bcmp(__s1_00,"bytes",5), iVar3 != 0)) {
LAB_0019d3ca:
                SVar12 = Token::range(&pNVar7->name);
                pDVar9 = addDiag(this,(DiagCode)0x2e0004,SVar12);
                arg = Token::valueText(&local_70);
                pDVar9 = Diagnostic::operator<<(pDVar9,arg);
                goto LAB_0019d436;
              }
              pPVar1 = (pNVar7->value).ptr;
              if (pPVar1 == (PragmaExpressionSyntax *)0x0) {
LAB_0019d684:
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<slang::syntax::PragmaExpressionSyntax *>::get() const [T = slang::syntax::PragmaExpressionSyntax *]"
                          );
              }
              oVar10 = requireUInt32(this,pPVar1);
              if (((ulong)oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
                this->protectBytes =
                     oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload;
              }
            }
          }
          else if (sVar8 == 0xb) {
            iVar3 = bcmp(__s1_00,"line_length",0xb);
            if (iVar3 != 0) goto LAB_0019d39c;
            pPVar1 = (pNVar7->value).ptr;
            if (pPVar1 == (PragmaExpressionSyntax *)0x0) goto LAB_0019d684;
            oVar10 = requireUInt32(this,pPVar1);
            if (((ulong)oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
              this->protectLineLength =
                   oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload;
            }
          }
          else {
            if ((sVar8 != 7) || (iVar3 = bcmp(__s1_00,"enctype",7), iVar3 != 0)) goto LAB_0019d3ca;
            pSVar6 = &((pNVar7->value).ptr)->super_SyntaxNode;
            if (pSVar6 == (SyntaxNode *)0x0) goto LAB_0019d684;
            local_40 = slang::syntax::SyntaxNode::getFirstToken(pSVar6);
            sVar11 = Token::valueText(&local_40);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_60,sVar11._M_str,sVar11._M_str + sVar11._M_len);
            strToLower(&local_60);
            sVar2 = local_60._M_string_length;
            __s1._M_p = local_60._M_dataplus._M_p;
            if ((long)local_60._M_string_length < 8) {
              if (local_60._M_string_length == 3) {
                iVar3 = bcmp(local_60._M_dataplus._M_p,"raw",3);
                if (iVar3 != 0) goto LAB_0019d5ab;
                this->protectEncoding = Raw;
              }
              else {
LAB_0019d511:
                if ((sVar2 == 6) && (iVar3 = bcmp(__s1._M_p,"base64",6), iVar3 == 0)) {
                  this->protectEncoding = Base64;
                }
                else {
LAB_0019d5ab:
                  this->protectEncoding = Raw;
                  SVar12 = Token::range(&local_40);
                  pDVar9 = addDiag(this,(DiagCode)0x2c0004,SVar12);
                  sVar11 = Token::valueText(&local_40);
                  Diagnostic::operator<<(pDVar9,sVar11);
                }
              }
            }
            else if (local_60._M_string_length == 0x10) {
              iVar3 = bcmp(local_60._M_dataplus._M_p,"quoted-printable",0x10);
              if (iVar3 != 0) goto LAB_0019d5ab;
              this->protectEncoding = QuotedPrintable;
            }
            else {
              if (local_60._M_string_length != 8) goto LAB_0019d5ab;
              iVar3 = bcmp(local_60._M_dataplus._M_p,"uuencode",8);
              if (iVar3 != 0) goto LAB_0019d511;
              this->protectEncoding = UUEncode;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          SVar12 = slang::syntax::SyntaxNode::sourceRange(pSVar6);
          pDVar9 = addDiag(this,(DiagCode)0x270004,SVar12);
          sVar11 = Token::valueText(&local_70);
LAB_0019d436:
          Diagnostic::operator<<(pDVar9,sVar11);
        }
        index = index + 1;
        if (uVar5 >> 1 == index) {
          return;
        }
      } while( true );
    }
    SVar12 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar9 = addDiag(this,(DiagCode)0x270004,SVar12);
  sVar11 = Token::valueText(&local_70);
  Diagnostic::operator<<(pDVar9,sVar11);
  return;
}

Assistant:

void Preprocessor::handleProtectEncoding(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    protectLineLength = 0;
    protectBytes = 0;

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "enctype"sv) {
            auto value = nvp.value->getFirstToken();

            std::string valueText(value.valueText());
            strToLower(valueText);

            if (valueText == "uuencode"sv) {
                protectEncoding = ProtectEncoding::UUEncode;
            }
            else if (valueText == "base64"sv) {
                protectEncoding = ProtectEncoding::Base64;
            }
            else if (valueText == "quoted-printable"sv) {
                protectEncoding = ProtectEncoding::QuotedPrintable;
            }
            else if (valueText == "raw"sv) {
                protectEncoding = ProtectEncoding::Raw;
            }
            else {
                protectEncoding = ProtectEncoding::Raw;
                addDiag(diag::UnknownProtectEncoding, value.range()) << value.valueText();
            }
        }
        else if (name == "line_length"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectLineLength = *num;
        }
        else if (name == "bytes"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectBytes = *num;
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}